

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

int __thiscall booster::aio::basic_socket::open(basic_socket *this,char *__file,int __oflag,...)

{
  int iVar1;
  undefined8 *extraout_RAX;
  undefined8 *in_RCX;
  int iVar2;
  error_code eVar3;
  native_type fd;
  error_code etmp;
  int type;
  int domain;
  undefined4 in_stack_ffffffffffffffa0;
  native_type fd_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uStack_44;
  undefined1 local_30 [16];
  int local_20;
  int local_1c;
  undefined8 *local_18;
  int local_10;
  int local_c;
  basic_socket *local_8;
  
  iVar2 = (int)__file;
  local_1c = 0;
  if (iVar2 == 0) {
    local_1c = 1;
  }
  else if (iVar2 == 1) {
    local_1c = 2;
  }
  else if (iVar2 == 2) {
    local_1c = 10;
  }
  local_20 = 0;
  if (__oflag == 0) {
    local_20 = 1;
  }
  else if (__oflag == 1) {
    local_20 = 2;
  }
  local_18 = in_RCX;
  local_10 = __oflag;
  local_c = iVar2;
  local_8 = this;
  std::error_code::error_code((error_code *)CONCAT44(__oflag,in_stack_ffffffffffffffa0));
  basic_io_device::close(&this->super_basic_io_device,(int)local_30);
  fd_00 = (native_type)((ulong)this >> 0x20);
  iVar1 = socket(local_1c,local_20,0);
  if (iVar1 == -1) {
    eVar3 = socket_details::geterror();
    *local_18 = CONCAT44(uStack_44,eVar3._M_value);
    local_18[1] = eVar3._M_cat;
  }
  else {
    basic_io_device::assign((basic_io_device *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),fd_00);
    local_18 = extraout_RAX;
  }
  return (int)local_18;
}

Assistant:

void basic_socket::open(family_type d,socket_type t,system::error_code &e)
{
	int domain=0;
	switch(d) {
	case pf_unix: domain=AF_UNIX; break;
	case pf_inet: domain=AF_INET; break;
	case pf_inet6: domain = AF_INET6; break;
	}
	int type = 0;
	switch(t) {
	case sock_stream: type = SOCK_STREAM; break;
	case sock_datagram: type = SOCK_DGRAM; break;
	}

	{
		system::error_code etmp;
		close(etmp);
	}
	native_type fd = ::socket(domain,type,0);
	if(fd == invalid_socket) {
		e=geterror();
		return;
	}
	assign(fd);
}